

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssUnsupportedHashOid_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssUnsupportedHashOid_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  Input algorithm_identifier;
  AssertionResult gtest_ar_;
  uint8_t kData [30];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  uchar local_38 [40];
  
  local_38[0x10] = '\r';
  local_38[0x11] = '0';
  local_38[0x12] = '\v';
  local_38[0x13] = '\x06';
  local_38[0x14] = '\t';
  local_38[0x15] = '`';
  local_38[0x16] = 0x86;
  local_38[0x17] = 'H';
  local_38[0x18] = '\x02';
  local_38[0x19] = 'g';
  local_38[0x1a] = '\x13';
  local_38[0x1b] = '\x04';
  local_38[0x1c] = '\x02';
  local_38[0x1d] = '\x02';
  local_38[0] = '0';
  local_38[1] = '\x1c';
  local_38[2] = '\x06';
  local_38[3] = '\t';
  local_38[4] = '*';
  local_38[5] = 0x86;
  local_38[6] = 'H';
  local_38[7] = 0x86;
  local_38[8] = 0xf7;
  local_38[9] = '\r';
  local_38[10] = '\x01';
  local_38[0xb] = '\x01';
  local_38[0xc] = '\n';
  local_38[0xd] = '0';
  local_38[0xe] = '\x0f';
  local_38[0xf] = 0xa0;
  algorithm_identifier.data_.size_ = 0x1e;
  algorithm_identifier.data_.data_ = local_38;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  local_68[0] = (internal)
                (((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload
                         .super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,(AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x2be,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssUnsupportedHashOid) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x1C,  // SEQUENCE (28 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x0F,  // SEQUENCE (15 bytes)
      0xA0, 0x0D,  // [0] (13 bytes)
      0x30, 0x0B,  // SEQUENCE (11 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x02, 0x67, 0x13, 0x04, 0x02, 0x02,
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}